

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall Logger::~Logger(Logger *this)

{
  thread *this_00;
  buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lck;
  Logger *this_local;
  
  lck._M_device = (mutex_type *)this;
  if (this->l_asyncw_thread != (thread *)0x0) {
    std::atomic<bool>::operator=(&this->is_thread_stop,true);
    bVar1 = std::thread::joinable(this->l_asyncw_thread);
    if (bVar1) {
      buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::notify(this->l_buffer_queue);
      std::thread::join();
    }
    this_00 = this->l_asyncw_thread;
    if (this_00 != (thread *)0x0) {
      std::thread::~thread(this_00);
      operator_delete(this_00,8);
    }
  }
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->l_mutex);
  if (this->l_fp != (FILE *)0x0) {
    fclose((FILE *)this->l_fp);
  }
  if ((this->l_buf != (char *)0x0) && (this->l_buf != (char *)0x0)) {
    operator_delete__(this->l_buf);
  }
  if ((this->l_buffer_queue !=
       (buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0) &&
     (this_01 = this->l_buffer_queue,
     this_01 !=
     (buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *)0x0)) {
    buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~buffer_queue(this_01);
    operator_delete(this_01,0x88);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

Logger::~Logger()
{
    if(l_asyncw_thread)
    {
        is_thread_stop = true;
        if(l_asyncw_thread->joinable())
        {
            l_buffer_queue->notify();
            l_asyncw_thread->join();
        }
        delete l_asyncw_thread;
    }

    lock_guard<mutex> lck (l_mutex);
    if (l_fp != NULL)
    {
        fclose(l_fp);
    }

    if(l_buf)
    {
        delete [] l_buf;
    }

    if(l_buffer_queue)
    {
        delete l_buffer_queue;
    }
}